

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O2

uint64_t __thiscall
GmmLib::GmmGen12TextureCalc::ScaleFCRectWidth
          (GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint64_t Width)

{
  GMM_TILE_MODE GVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  char cVar8;
  
  if (((ulong)(pTexInfo->Flags).Gpu & 2) == 0) {
    return Width;
  }
  iVar3 = (*((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
             super_GmmTextureCalc.pGmmLibContext)->pPlatformInfo->_vptr_PlatformInfo[10])();
  GVar1 = pTexInfo->TileMode;
  uVar5 = (ulong)GVar1;
  if (uVar5 < 0x30) {
    if ((0xf8000003e000U >> (uVar5 & 0x3f) & 1) == 0) {
      cVar8 = '\0';
      if (uVar5 == 2) goto LAB_001b5855;
      goto LAB_001b5807;
    }
  }
  else {
LAB_001b5807:
    uVar6 = GVar1 - TILE4;
    if (0x19 < uVar6) {
      return Width;
    }
    if ((0x3e007c0U >> (uVar6 & 0x1f) & 1) == 0) {
      if (uVar6 != 0) {
        return Width;
      }
      cVar8 = '\x0f';
      goto LAB_001b5855;
    }
  }
  if (GVar1 - TILE_YF_2D_8bpe < 5) {
    cVar8 = '\x05';
  }
  else if (GVar1 - TILE_YS_2D_8bpe < 5) {
    cVar8 = '\n';
  }
  else if (GVar1 - TILE__64_2D_8bpe < 5) {
    cVar8 = '\x14';
  }
  else {
    cVar8 = (GVar1 < TILE__64_3D_8bpe) * '\x05' + '\x19';
  }
LAB_001b5855:
  uVar4 = __GmmLog2(pTexInfo->BitsPerPixel);
  bVar2 = ((char)uVar4 + cVar8) - 3;
  if (bVar2 < 0x1e) {
    lVar7 = (ulong)bVar2 * 0x18;
    uVar5 = (ulong)(*(int *)(CONCAT44(extraout_var,iVar3) + lVar7) - 1);
    Width = (~uVar5 & Width + uVar5) /
            (ulong)(long)*(int *)(CONCAT44(extraout_var,iVar3) + 0xc + lVar7);
  }
  return Width;
}

Assistant:

uint64_t GMM_STDCALL GmmLib::GmmGen12TextureCalc::ScaleFCRectWidth(GMM_TEXTURE_INFO *pTexInfo, uint64_t Width)
{
    uint64_t ScaledWidth = Width;
    if(pTexInfo->Flags.Gpu.CCS)
    {
        CCS_UNIT *FCRectAlign = static_cast<PlatformInfoGen12 *>(pGmmLibContext->GetPlatformInfoObj())->GetFCRectAlign();	    
        uint8_t   index       = FCMaxModes;
        if((index = FCMode(pTexInfo->TileMode, pTexInfo->BitsPerPixel)) < FCMaxModes)
        {
            ScaledWidth = GFX_ALIGN(ScaledWidth, FCRectAlign[index].Align.Width);
            ScaledWidth /= FCRectAlign[index].Downscale.Width;
        }
        else
        {
            //Unsupported tiling-type for FastClear
            __GMM_ASSERT(0);
        }
    }

    return ScaledWidth;
}